

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O0

void __thiscall
smf::MidiMessage::makeMts9_TemperamentByCentsDeviationFromET
          (MidiMessage *this,vector<double,_std::allocator<double>_> *mapping,
          int referencePitchClass,int channelMask)

{
  int iVar1;
  size_type sVar2;
  ostream *poVar3;
  reference pvVar4;
  byte local_66;
  byte local_65;
  uint local_64;
  uchar MSB_1;
  uchar LSB_1;
  double dStack_60;
  int intval;
  double value;
  int local_50;
  int ii;
  int i;
  uchar LSB;
  uchar MSB;
  uchar MMSB;
  undefined1 local_38 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  int channelMask_local;
  int referencePitchClass_local;
  vector<double,_std::allocator<double>_> *mapping_local;
  MidiMessage *this_local;
  
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = channelMask;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = referencePitchClass;
  sVar2 = std::vector<double,_std::allocator<double>_>::size(mapping);
  if (sVar2 == 0xc) {
    if (data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ < 0) {
      poVar3 = std::operator<<((ostream *)&std::cerr,
                               "Error: Cannot have a negative reference pitch class");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    else {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,0x1f);
      i._3_1_ = 0x7f;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,
                 (value_type_conflict2 *)((long)&i + 3));
      i._2_1_ = 0x7f;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,
                 (value_type_conflict2 *)((long)&i + 2));
      i._1_1_ = 8;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,
                 (value_type_conflict2 *)((long)&i + 1));
      i._0_1_ = 9;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,
                 (value_type_conflict2 *)&i);
      ii._3_1_ = (byte)((uint)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage >> 0xe) & 3;
      ii._2_1_ = (byte)((uint)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage >> 7) & 0x7f;
      ii._1_1_ = (byte)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage & 0x7f;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,
                 (value_type_conflict2 *)((long)&ii + 3));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,
                 (value_type_conflict2 *)((long)&ii + 2));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,
                 (value_type_conflict2 *)((long)&ii + 1));
      local_50 = 0;
      while( true ) {
        iVar1 = local_50;
        sVar2 = std::vector<double,_std::allocator<double>_>::size(mapping);
        if ((int)sVar2 <= iVar1) break;
        iVar1 = (local_50 -
                data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._4_4_) + 0x30;
        value._4_4_ = iVar1 + (((uint)(iVar1 / 6 + (iVar1 >> 0x1f)) >> 1) - (iVar1 >> 0x1f)) * -0xc;
        pvVar4 = std::vector<double,_std::allocator<double>_>::at(mapping,(long)value._4_4_);
        dStack_60 = *pvVar4 / 100.0;
        if (1.0 < dStack_60) {
          dStack_60 = 1.0;
        }
        if (dStack_60 < -1.0) {
          dStack_60 = -1.0;
        }
        local_64 = (uint)((dStack_60 + 1.0) * 8191.5 + 0.5);
        local_65 = (byte)local_64 & 0x7f;
        local_66 = (byte)(local_64 >> 7) & 0x7f;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,&local_66);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,&local_65);
        local_50 = local_50 + 1;
      }
      makeSysExMessage(this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
    }
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Error: input mapping must have a size of 12.");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void MidiMessage::makeMts9_TemperamentByCentsDeviationFromET (std::vector<double>& mapping, int referencePitchClass, int channelMask) {
	if (mapping.size() != 12) {
		std::cerr << "Error: input mapping must have a size of 12." << std::endl;
		return;
	}
	if (referencePitchClass < 0) {
		std::cerr << "Error: Cannot have a negative reference pitch class" << std::endl;
		return;
	}

	std::vector<uchar> data;
	data.reserve(24 + 7);

	data.push_back((uchar)0x7f);  // real-time sysex
	data.push_back((uchar)0x7f);  // all devices
	data.push_back((uchar)0x08);  // sub-ID#1 (MIDI Tuning)
	data.push_back((uchar)0x09);  // sub-ID#2 (note change)

	uchar MMSB = (channelMask >> 14) & 0x3;
	uchar MSB  = (channelMask >> 7)  & 0x7f;
	uchar LSB  = channelMask & 0x7f;

	data.push_back(MMSB);
	data.push_back(MSB);
	data.push_back(LSB);

	for (int i=0; i<(int)mapping.size(); i++) {
		int ii = (i - referencePitchClass + 48) % 12;
		double value = mapping.at(ii) / 100.0;

		if (value > 1.0) {
			value = 1.0;
		}
		if (value < -1.0) {
			value = -1.0;
		}

		int intval = (int)(((1 << 13)-0.5)  * (value + 1.0) + 0.5);
		uchar LSB = intval & 0x7f;
		uchar MSB = (intval >>  7) & 0x7f;
		data.push_back(MSB);
		data.push_back(LSB);
	}
	this->makeSysExMessage(data);
}